

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodstobin.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 extraout_RAX;
  char *__end;
  pointer unaff_R14;
  pointer unaff_R15;
  string local_58;
  string local_38;
  
  iVar1 = getopt(argc,argv,"vh");
  if (iVar1 == -1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"","");
    initstreams(&local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    doit();
    return 0;
  }
  if (iVar1 != 0x68) {
    if (iVar1 != 0x76) goto LAB_00101485;
    main_cold_2();
  }
  main_cold_1();
LAB_00101485:
  main_cold_3();
  if (local_58._M_dataplus._M_p != unaff_R15) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_38._M_dataplus._M_p != unaff_R14) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char *argv[])
{
	int opt;

	while ((opt = getopt(argc, argv, "vh")) != -1) {
		switch (opt) {		
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'h':
			help();
			exit(EXIT_FAILURE);
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}
	

	initstreams("", "");
    doit();
    return EXIT_SUCCESS;
}